

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.hpp
# Opt level: O0

void __thiscall EIF_Data_Base<EIF>::EIF_Data_Base(EIF_Data_Base<EIF> *this)

{
  EIF_Data_Base<EIF> *this_local;
  
  this->id = 0;
  std::__cxx11::string::string((string *)&this->name);
  this->graphic = 0;
  this->type = Static;
  this->subtype = None;
  this->special = Lore;
  this->hp = 0;
  this->tp = 0;
  this->mindam = 0;
  this->maxdam = 0;
  this->accuracy = 0;
  this->evade = 0;
  this->armor = 0;
  this->str = '\0';
  this->intl = '\0';
  this->wis = '\0';
  this->agi = '\0';
  this->con = '\0';
  this->cha = '\0';
  this->light = '\0';
  this->dark = '\0';
  this->earth = '\0';
  this->air = '\0';
  this->water = '\0';
  this->fire = '\0';
  (this->field_25).scrollmap = 0;
  (this->field_26).gender = '\0';
  (this->field_27).scrolly = '\0';
  this->levelreq = 0;
  this->classreq = 0;
  this->strreq = 0;
  this->intreq = 0;
  this->wisreq = 0;
  this->agireq = 0;
  this->conreq = 0;
  this->chareq = 0;
  this->weight = '\0';
  this->size = Size1x1;
  return;
}

Assistant:

EIF_Data_Base() : id(0), graphic(0), type(EIF::Static), subtype(EIF::None), special(EIF::Lore),
	hp(0), tp(0), mindam(0), maxdam(0), accuracy(0), evade(0), armor(0), str(0), intl(0), wis(0),
	agi(0), con(0), cha(0), light(0), dark(0), earth(0), air(0), water(0), fire(0), scrollmap(0),
	gender(0), scrolly(0), levelreq(0), classreq(0), strreq(0), intreq(0), wisreq(0), agireq(0),
	conreq(0), chareq(0), weight(0), size(EIF::Size1x1) { }